

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void ImBitArraySetBitRange(ImU32 *arr,int n,int n2)

{
  int iVar1;
  byte local_20;
  ImU32 mask;
  int b_mod;
  int a_mod;
  int n2_local;
  int n_local;
  ImU32 *arr_local;
  
  iVar1 = n2 + -1;
  for (n_local = n; n_local <= iVar1; n_local = n_local + 0x20U & 0xffffffe0) {
    if ((int)(n_local | 0x1fU) < iVar1) {
      local_20 = 0x1f;
    }
    else {
      local_20 = (byte)iVar1 & 0x1f;
    }
    arr[n_local >> 5] =
         (int)(1L << local_20 + 1) - 1U & ((int)(1L << ((byte)n_local & 0x1f)) - 1U ^ 0xffffffff) |
         arr[n_local >> 5];
  }
  return;
}

Assistant:

inline void     ImBitArraySetBitRange(ImU32* arr, int n, int n2) // Works on range [n..n2)
{
    n2--;
    while (n <= n2)
    {
        int a_mod = (n & 31);
        int b_mod = (n2 > (n | 31) ? 31 : (n2 & 31)) + 1;
        ImU32 mask = (ImU32)(((ImU64)1 << b_mod) - 1) & ~(ImU32)(((ImU64)1 << a_mod) - 1);
        arr[n >> 5] |= mask;
        n = (n + 32) & ~31;
    }
}